

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftext.c
# Opt level: O1

void riffts(float *data,long M,long Rows)

{
  riffts1(data,M,Rows,UtblArray[M],BRLowArray[(ulong)((M + -1) - (M + -1 >> 0x3f)) >> 1]);
  return;
}

Assistant:

void riffts(float *data, long M, long Rows){
/* Compute in-place real ifft on the rows of the input array	*/
/* data order as from rffts */
/* INPUTS */
/* *ioptr = input data array in the following order	*/
/* M = log2 of fft size	(ex M=10 for 1024 point fft) */
/* Re(x[0]), Re(x[N/2]), Re(x[1]), Im(x[1]), Re(x[2]), Im(x[2]), ... Re(x[N/2-1]), Im(x[N/2-1]). */
/* Rows = number of rows in ioptr array (use 1 for Rows for a single fft)	*/
/* OUTPUTS */
/* *ioptr = real output data array	*/
	riffts1(data, M, Rows, UtblArray[M], BRLowArray[(M-1)/2]);
}